

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t pax_attribute_SUN_holesdata
                  (archive_read *a,tar *tar,archive_entry *entry,char *p,size_t length)

{
  wchar_t wVar1;
  int64_t iVar2;
  bool bVar3;
  uint local_54;
  long lStack_50;
  wchar_t hole;
  int64_t end;
  int64_t start;
  char *e;
  size_t length_local;
  char *p_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_54 = 1;
  lStack_50 = 0;
  if (length == 0) {
    a_local._4_4_ = L'\xffffffec';
  }
  else if (*p == ' ') {
    length_local = (size_t)(p + 1);
    e = (char *)(length - 1);
    while( true ) {
      start = length_local;
      while( true ) {
        bVar3 = false;
        if (e != (char *)0x0) {
          bVar3 = *(char *)start != ' ';
        }
        if (!bVar3) break;
        if ((*(char *)start < '0') || ('9' < *(char *)start)) {
          return L'\xffffffec';
        }
        start = start + 1;
        e = e + -1;
      }
      iVar2 = tar_atol10((char *)length_local,start - length_local);
      if (iVar2 < 0) {
        return L'\xffffffec';
      }
      if (lStack_50 < iVar2) {
        wVar1 = gnu_add_sparse_entry(a,tar,lStack_50,iVar2 - lStack_50);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
        tar->sparse_last->hole = local_54;
      }
      if ((e == (char *)0x0) || (*(char *)start == '\n')) break;
      length_local = start + 1;
      e = e + -1;
      local_54 = (uint)(local_54 == 0);
      lStack_50 = iVar2;
    }
    if ((e == (char *)0x0) && (*(char *)start == '\n')) {
      a_local._4_4_ = L'\0';
    }
    else {
      a_local._4_4_ = L'\xffffffec';
    }
  }
  else {
    a_local._4_4_ = L'\xffffffec';
  }
  return a_local._4_4_;
}

Assistant:

static int
pax_attribute_SUN_holesdata(struct archive_read *a, struct tar *tar,
	struct archive_entry *entry, const char *p, size_t length)
{
	const char *e;
	int64_t start, end;
	int hole = 1;

	(void)entry; /* UNUSED */

	end = 0;
	if (length <= 0)
		return (ARCHIVE_WARN);
	if (*p == ' ') {
		p++;
		length--;
	} else {
		return (ARCHIVE_WARN);
	}
	for (;;) {
		e = p;
		while (length > 0 && *e != ' ') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
			length--;
		}
		start = end;
		end = tar_atol10(p, e - p);
		if (end < 0)
			return (ARCHIVE_WARN);
		if (start < end) {
			if (gnu_add_sparse_entry(a, tar, start,
			    end - start) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			tar->sparse_last->hole = hole;
		}
		if (length == 0 || *e == '\n') {
			if (length == 0 && *e == '\n') {
				return (ARCHIVE_OK);
			} else {
				return (ARCHIVE_WARN);
			}
		}
		p = e + 1;
		length--;
		hole = hole == 0;
	}
}